

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SBG.h
# Opt level: O3

void EncodeFrameSBG(uchar *frame,int *pframelen,uchar mid,uchar mclass,uchar *payload,int len)

{
  uint uVar1;
  ushort uVar2;
  undefined2 uVar3;
  uint uVar4;
  ulong uVar5;
  size_t __n;
  char cVar6;
  uint uVar7;
  
  frame[0] = 0xff;
  frame[1] = 'Z';
  frame[2] = mid;
  frame[3] = mclass;
  frame[4] = (uchar)len;
  frame[5] = (uchar)((uint)len >> 8);
  __n = (size_t)len;
  memcpy(frame + 6,payload,__n);
  uVar2 = (short)len + 4;
  if (uVar2 == 0) {
    uVar3 = 0;
  }
  else {
    uVar5 = 0;
    uVar4 = 0;
    do {
      uVar4 = uVar4 ^ frame[uVar5 + 2];
      cVar6 = '\b';
      do {
        uVar7 = (uVar4 & 0xffff) >> 1;
        uVar1 = uVar4 & 1;
        uVar4 = uVar7 ^ 0xffff8408;
        if (uVar1 == 0) {
          uVar4 = uVar7;
        }
        uVar3 = (undefined2)uVar4;
        cVar6 = cVar6 + -1;
      } while (cVar6 != '\0');
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar2);
  }
  frame[__n + 6] = (uchar)uVar3;
  frame[__n + 7] = (uchar)((ushort)uVar3 >> 8);
  frame[__n + 8] = '3';
  *pframelen = len + 9;
  return;
}

Assistant:

inline void EncodeFrameSBG(unsigned char* frame, int* pframelen, unsigned char mid, unsigned char mclass, unsigned char* payload, int len)
{
	int offset = 0;
	uint16 crc = 0;

	frame[0] = (unsigned char)SYNC1_SBG;
	frame[1] = (unsigned char)SYNC2_SBG;
	frame[2] = (unsigned char)mid;
	frame[3] = (unsigned char)mclass;
	frame[4] = (unsigned char)(len&0xFF);
	frame[5] = (unsigned char)(len>>8);
	offset = FRAME_HEADER_LEN_SBG;
	memcpy(frame+offset, payload, len);
	offset += len;
	crc = CalcCRCSBG(frame+2, (uint16)(offset-2));
	frame[offset] = (unsigned char)(crc&0xFF);
	offset++;
	frame[offset] = (unsigned char)(crc>>8);
	offset++;
	frame[offset] = (unsigned char)ETX_SBG;
	*pframelen = len+MIN_FRAME_LEN_SBG;
}